

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O0

void * ZSTD_cwksp_reserve_object(ZSTD_cwksp *ws,size_t bytes)

{
  size_t sVar1;
  void *pvVar2;
  void *end;
  void *alloc;
  size_t roundedBytes;
  size_t bytes_local;
  ZSTD_cwksp *ws_local;
  
  sVar1 = ZSTD_cwksp_align(bytes,8);
  ws_local = (ZSTD_cwksp *)ws->objectEnd;
  pvVar2 = (void *)((long)&ws_local->workspace + sVar1);
  ZSTD_cwksp_assert_internal_consistency(ws);
  if ((ws->phase == ZSTD_cwksp_alloc_objects) && (pvVar2 <= ws->workspaceEnd)) {
    ws->objectEnd = pvVar2;
    ws->tableEnd = pvVar2;
    ws->tableValidEnd = pvVar2;
  }
  else {
    ws->allocFailed = '\x01';
    ws_local = (ZSTD_cwksp *)0x0;
  }
  return ws_local;
}

Assistant:

MEM_STATIC void* ZSTD_cwksp_reserve_object(ZSTD_cwksp* ws, size_t bytes) {
    size_t roundedBytes = ZSTD_cwksp_align(bytes, sizeof(void*));
    void* alloc = ws->objectEnd;
    void* end = (BYTE*)alloc + roundedBytes;

#if ZSTD_ADDRESS_SANITIZER && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    /* over-reserve space */
    end = (BYTE *)end + 2 * ZSTD_CWKSP_ASAN_REDZONE_SIZE;
#endif

    DEBUGLOG(5,
        "cwksp: reserving %p object %zd bytes (rounded to %zd), %zd bytes remaining",
        alloc, bytes, roundedBytes, ZSTD_cwksp_available_space(ws) - roundedBytes);
    assert(((size_t)alloc & (sizeof(void*)-1)) == 0);
    assert((bytes & (sizeof(void*)-1)) == 0);
    ZSTD_cwksp_assert_internal_consistency(ws);
    /* we must be in the first phase, no advance is possible */
    if (ws->phase != ZSTD_cwksp_alloc_objects || end > ws->workspaceEnd) {
        DEBUGLOG(4, "cwksp: object alloc failed!");
        ws->allocFailed = 1;
        return NULL;
    }
    ws->objectEnd = end;
    ws->tableEnd = end;
    ws->tableValidEnd = end;

#if ZSTD_ADDRESS_SANITIZER && !defined (ZSTD_ASAN_DONT_POISON_WORKSPACE)
    /* Move alloc so there's ZSTD_CWKSP_ASAN_REDZONE_SIZE unused space on
     * either size. */
    alloc = (BYTE *)alloc + ZSTD_CWKSP_ASAN_REDZONE_SIZE;
    if (ws->isStatic == ZSTD_cwksp_dynamic_alloc) {
        __asan_unpoison_memory_region(alloc, bytes);
    }
#endif

    return alloc;
}